

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

PrimitiveSymbol * slang::ast::PrimitiveSymbol::fromSyntax(Scope *scope,UdpDeclarationSyntax *syntax)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  SyntaxKind SVar2;
  UdpBodySyntax *pUVar3;
  long lVar4;
  UdpInitialStmtSyntax *this;
  Type *this_00;
  size_t sVar5;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_03;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_04;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  Token TVar8;
  pointer ppPVar9;
  bool bVar10;
  logic_t lVar11;
  logic_t lVar12;
  int iVar13;
  bitwidth_t bVar14;
  PrimitiveSymbol *this_01;
  UdpPortDeclSyntax *pUVar15;
  UdpOutputPortDeclSyntax *pUVar16;
  SourceLocation SVar17;
  PrimitivePortSymbol *pPVar18;
  Compilation *args;
  IdentifierNameSyntax *pIVar19;
  NonAnsiUdpPortListSyntax *pNVar20;
  UdpInputPortDeclSyntax *pUVar21;
  iterator iVar22;
  PrimitiveSymbol *pPVar23;
  undefined4 extraout_var;
  Diagnostic *pDVar24;
  Expression *this_02;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_03;
  size_t __n;
  logic_error *this_04;
  long *plVar25;
  ulong uVar26;
  size_type *psVar27;
  long *plVar28;
  char *pcVar29;
  bitmask<slang::ast::ASTFlags> *pbVar30;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  size_type extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  EVP_PKEY_CTX *extraout_RDX_12;
  EVP_PKEY_CTX *extraout_RDX_13;
  EVP_PKEY_CTX *extraout_RDX_14;
  EVP_PKEY_CTX *extraout_RDX_15;
  EVP_PKEY_CTX *extraout_RDX_16;
  EVP_PKEY_CTX *extraout_RDX_17;
  EVP_PKEY_CTX *extraout_RDX_18;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  long lVar31;
  undefined1 *puVar32;
  DiagCode code;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *index;
  AnsiUdpPortListSyntax *index_00;
  char cVar33;
  size_t index_01;
  SyntaxNode *pSVar34;
  size_type __rlen;
  SourceRange SVar35;
  string_view sVar36;
  string_view arg;
  PrimitivePortSymbol *port;
  PrimitivePortSymbol *port_1;
  PrimitivePortDirection dir;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> ports;
  Token name;
  UdpOutputPortDeclSyntax *local_220;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  long local_208;
  long lStack_200;
  Token local_1f8;
  UdpDeclarationSyntax *local_1d8;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *local_1d0;
  AnsiUdpPortListSyntax *local_1c8;
  UdpPortDeclSyntax *local_1c0;
  Compilation *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> local_190 [2];
  anon_union_8_2_f12d5f64_for_typeOrLink local_150 [2];
  undefined1 local_140 [16];
  AnsiUdpPortListSyntax *local_130;
  undefined1 local_128 [16];
  bitmask<slang::ast::ASTFlags> local_118;
  Symbol *pSStack_110;
  TempVarSymbol *local_108;
  RandomizeDetails *pRStack_100;
  AssertionInstanceDetails *local_f8;
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
  *local_a8;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
  local_a0;
  string local_78;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  undefined4 extraout_var_00;
  
  args = scope->compilation;
  local_128 = (undefined1  [16])parsing::Token::valueText(&syntax->name);
  local_190[0].data_ = (pointer)parsing::Token::location(&syntax->name);
  auVar7._12_4_ = 0;
  auVar7._0_12_ = stack0xfffffffffffffdec;
  _local_218 = (Token)(auVar7 << 0x20);
  local_1b8 = args;
  this_01 = BumpAllocator::
            emplace<slang::ast::PrimitiveSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitiveSymbol::PrimitiveKind>
                      (&args->super_BumpAllocator,args,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_128,
                       (SourceLocation *)local_190,(PrimitiveKind *)local_218);
  psVar1 = &(syntax->super_MemberSyntax).attributes.
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
  syntax_00.data_ = psVar1->data_;
  syntax_00.size_ = psVar1->size_;
  if ((syntax->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ != 0 &&
      psVar1->data_ == (pointer)0x0) {
    std::terminate();
  }
  Symbol::setAttributes(&this_01->super_Symbol,scope,syntax_00);
  (this_01->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  local_190[0].data_ = (pointer)local_190[0].firstElement;
  local_190[0].len = 0;
  local_190[0].cap = 5;
  pSVar34 = &((syntax->portList).ptr)->super_SyntaxNode;
  local_1d8 = syntax;
  if (pSVar34 == (SyntaxNode *)0x0) {
    pcVar29 = 
    "T slang::not_null<slang::syntax::UdpPortListSyntax *>::get() const [T = slang::syntax::UdpPortListSyntax *]"
    ;
LAB_001c6beb:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,pcVar29);
  }
  SVar2 = pSVar34->kind;
  pcVar29 = extraout_RDX;
  if (SVar2 != WildcardUdpPortList) {
    if (SVar2 == NonAnsiUdpPortList) {
      local_a8 = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
                  *)local_128;
      local_a0.
      super_StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
      .storage = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
                  *)local_128;
      local_a0.entries =
           ska::detailv3::
           empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>
                     ();
      local_a0.num_slots_minus_one = 0;
      local_a0.hash_policy.shift = '?';
      local_a0.max_lookups = '\x03';
      local_a0._max_load_factor = 0.5;
      local_a0.num_elements = 0;
      pSVar34 = &((local_1d8->portList).ptr)->super_SyntaxNode;
      if (pSVar34 == (SyntaxNode *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<slang::syntax::UdpPortListSyntax *>::get() const [T = slang::syntax::UdpPortListSyntax *]"
                  );
      }
      pNVar20 = slang::syntax::SyntaxNode::as<slang::syntax::NonAnsiUdpPortListSyntax>(pSVar34);
      uVar26 = (pNVar20->ports).elements.size_ + 1;
      if (1 < uVar26) {
        args = (Compilation *)0x0;
        do {
          pIVar19 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                    operator[](&pNVar20->ports,(size_t)args);
          _local_218 = pIVar19->identifier;
          local_1f8 = (Token)parsing::Token::valueText((Token *)local_218);
          local_150[0] = (anon_union_8_2_f12d5f64_for_typeOrLink)
                         parsing::Token::location((Token *)local_218);
          local_78._M_dataplus._M_p._0_4_ = 0;
          local_1b0._M_dataplus._M_p =
               (pointer)BumpAllocator::
                        emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                                  (&local_1b8->super_BumpAllocator,local_1b8,
                                   (basic_string_view<char,_std::char_traits<char>_> *)&local_1f8,
                                   (SourceLocation *)local_150,(PrimitivePortDirection *)&local_78);
          SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
          emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                    ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)local_190,
                     (PrimitivePortSymbol **)&local_1b0);
          Scope::addMember(&this_01->super_Scope,(Symbol *)local_1b0._M_dataplus._M_p);
          sVar36 = parsing::Token::valueText((Token *)local_218);
          if (sVar36._M_len != 0) {
            local_1f8 = (Token)parsing::Token::valueText((Token *)local_218);
            ska::detailv3::
            sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>>
            ::
            emplace<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*&>
                      ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>>
                        *)&local_a0,(basic_string_view<char,_std::char_traits<char>_> *)&local_1f8,
                       (PrimitivePortSymbol **)&local_1b0);
          }
          args = (Compilation *)
                 ((long)&(((UdpPortDeclSyntax *)&args->super_BumpAllocator)->super_SyntaxNode).
                         parent + 1);
        } while ((Compilation *)(uVar26 >> 1) != args);
      }
      pUVar3 = (local_1d8->body).ptr;
      if (pUVar3 == (UdpBodySyntax *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<slang::syntax::UdpBodySyntax *>::get() const [T = slang::syntax::UdpBodySyntax *]"
                  );
      }
      uVar26 = (pUVar3->portDecls).elements.size_ + 1;
      if (uVar26 < 2) {
        pUVar16 = (UdpOutputPortDeclSyntax *)0x0;
      }
      else {
        local_1d0 = &pUVar3->portDecls;
        local_130 = (AnsiUdpPortListSyntax *)(uVar26 >> 1);
        local_220 = (UdpOutputPortDeclSyntax *)0x0;
        index_00 = (AnsiUdpPortListSyntax *)0x0;
        do {
          local_1c8 = index_00;
          pUVar15 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::operator[]
                              (local_1d0,(size_t)index_00);
          pUVar16 = local_220;
          if ((pUVar15->super_SyntaxNode).kind == UdpOutputPortDecl) {
            pUVar16 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>
                                (&pUVar15->super_SyntaxNode);
            args = (Compilation *)&pUVar16->name;
            _local_218 = (Token)parsing::Token::valueText((Token *)args);
            iVar22 = ska::detailv3::
                     sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                     ::find(&local_a0,(basic_string_view<char,_std::char_traits<char>_> *)local_218)
            ;
            if (iVar22.current ==
                local_a0.entries + local_a0.num_slots_minus_one + (long)local_a0.max_lookups) {
              SVar35 = parsing::Token::range((Token *)args);
              pDVar24 = Scope::addDiag(scope,(DiagCode)0x800006,SVar35);
              sVar36 = parsing::Token::valueText((Token *)args);
              Diagnostic::operator<<(pDVar24,sVar36);
              pUVar16 = local_220;
            }
            else if (((pUVar16->reg).info == (Info *)0x0) ||
                    ((pUVar16->keyword).info != (Info *)0x0)) {
              pPVar18 = ((iVar22.current)->field_1).value.second;
              _local_218 = pUVar16->name;
              if ((pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax != (SyntaxNode *)0x0)
              {
                SVar35 = parsing::Token::range((Token *)local_218);
                pDVar24 = Scope::addDiag(scope,(DiagCode)0x7e0006,SVar35);
                sVar36 = parsing::Token::valueText((Token *)local_218);
                Diagnostic::operator<<(pDVar24,sVar36);
                Diagnostic::addNote(pDVar24,(DiagCode)0x80001,
                                    (pPVar18->super_ValueSymbol).super_Symbol.location);
              }
              pPVar18->direction = Out;
              pPVar18->direction = OutReg - ((pUVar16->reg).info == (Info *)0x0);
              SVar17 = parsing::Token::location((Token *)args);
              (pPVar18->super_ValueSymbol).super_Symbol.location = SVar17;
              (pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)pUVar16;
              syntax_04.data_ =
                   (pUVar15->attributes).
                   super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                   data_;
              syntax_04.size_ =
                   (pUVar15->attributes).
                   super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                   size_;
              Symbol::setAttributes((Symbol *)pPVar18,scope,syntax_04);
              pUVar16 = local_220;
            }
            else if (local_220 != (UdpOutputPortDeclSyntax *)0x0) {
              SVar35 = parsing::Token::range(&pUVar16->reg);
              pDVar24 = Scope::addDiag(scope,(DiagCode)0x810006,SVar35);
              SVar17 = parsing::Token::location(&local_220->reg);
              Diagnostic::addNote(pDVar24,(DiagCode)0x80001,SVar17);
            }
          }
          else {
            local_1c0 = pUVar15;
            pUVar21 = slang::syntax::SyntaxNode::as<slang::syntax::UdpInputPortDeclSyntax>
                                (&pUVar15->super_SyntaxNode);
            uVar26 = (pUVar21->names).elements.size_ + 1;
            if (1 < uVar26) {
              args = (Compilation *)0x0;
              do {
                pIVar19 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                          operator[](&pUVar21->names,(size_t)args);
                local_1f8 = pIVar19->identifier;
                _local_218 = (Token)parsing::Token::valueText(&local_1f8);
                iVar22 = ska::detailv3::
                         sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                         ::find(&local_a0,
                                (basic_string_view<char,_std::char_traits<char>_> *)local_218);
                if (iVar22.current ==
                    local_a0.entries + local_a0.num_slots_minus_one + (long)local_a0.max_lookups) {
                  SVar35 = parsing::Token::range(&local_1f8);
                  pDVar24 = Scope::addDiag(scope,(DiagCode)0x800006,SVar35);
                  sVar36 = parsing::Token::valueText(&local_1f8);
                  Diagnostic::operator<<(pDVar24,sVar36);
                }
                else {
                  pPVar18 = ((iVar22.current)->field_1).value.second;
                  _local_218 = local_1f8;
                  if ((pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax !=
                      (SyntaxNode *)0x0) {
                    SVar35 = parsing::Token::range((Token *)local_218);
                    pDVar24 = Scope::addDiag(scope,(DiagCode)0x7e0006,SVar35);
                    sVar36 = parsing::Token::valueText((Token *)local_218);
                    Diagnostic::operator<<(pDVar24,sVar36);
                    Diagnostic::addNote(pDVar24,(DiagCode)0x80001,
                                        (pPVar18->super_ValueSymbol).super_Symbol.location);
                  }
                  SVar17 = parsing::Token::location(&local_1f8);
                  (pPVar18->super_ValueSymbol).super_Symbol.location = SVar17;
                  (pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax =
                       (SyntaxNode *)pIVar19;
                  syntax_03.data_ =
                       (local_1c0->attributes).
                       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                       data_;
                  syntax_03.size_ =
                       (local_1c0->attributes).
                       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                       size_;
                  Symbol::setAttributes((Symbol *)pPVar18,scope,syntax_03);
                }
                args = (Compilation *)
                       ((long)&(((UdpPortDeclSyntax *)&args->super_BumpAllocator)->super_SyntaxNode)
                               .parent + 1);
              } while ((Compilation *)(uVar26 >> 1) != args);
            }
          }
          index_00 = (AnsiUdpPortListSyntax *)
                     ((long)&(local_1c8->super_UdpPortListSyntax).super_SyntaxNode.parent + 1);
          local_220 = pUVar16;
        } while (index_00 != local_130);
      }
      if (pUVar16 != (UdpOutputPortDeclSyntax *)0x0) {
        local_1f8 = pUVar16->name;
        _local_218 = (Token)parsing::Token::valueText(&local_1f8);
        iVar22 = ska::detailv3::
                 sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                 ::find(&local_a0,(basic_string_view<char,_std::char_traits<char>_> *)local_218);
        if (iVar22.current ==
            local_a0.entries + local_a0.num_slots_minus_one + (long)local_a0.max_lookups) {
          assert::assertFailed
                    ("it != portMap.end()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                     ,0x36b,
                     "static PrimitiveSymbol &slang::ast::PrimitiveSymbol::fromSyntax(const Scope &, const UdpDeclarationSyntax &)"
                    );
        }
        pPVar18 = ((iVar22.current)->field_1).value.second;
        if ((pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax != (SyntaxNode *)0x0) {
          if (pPVar18->direction == In) {
            SVar35 = parsing::Token::range(&local_1f8);
            pDVar24 = Scope::addDiag(scope,(DiagCode)0x820006,SVar35);
            Diagnostic::operator<<(pDVar24,(pPVar18->super_ValueSymbol).super_Symbol.name);
          }
          else if (pPVar18->direction == OutReg) {
            _local_218 = local_1f8;
            SVar35 = parsing::Token::range((Token *)local_218);
            pDVar24 = Scope::addDiag(scope,(DiagCode)0x7e0006,SVar35);
            sVar36 = parsing::Token::valueText((Token *)local_218);
            Diagnostic::operator<<(pDVar24,sVar36);
            Diagnostic::addNote(pDVar24,(DiagCode)0x80001,
                                (pPVar18->super_ValueSymbol).super_Symbol.location);
          }
          else {
            pPVar18->direction = OutReg;
          }
        }
      }
      ppPVar9 = local_190[0].data_;
      if (local_190[0].len != 0) {
        lVar31 = local_190[0].len << 3;
        args = (Compilation *)0x0;
        do {
          lVar4 = *(long *)((long)ppPVar9 + (long)args);
          if (*(long *)(lVar4 + 0x38) == 0) {
            pDVar24 = Scope::addDiag(scope,(DiagCode)0x7f0006,*(SourceLocation *)(lVar4 + 0x18));
            Diagnostic::operator<<(pDVar24,*(string_view *)(lVar4 + 8));
          }
          args = (Compilation *)((long)args + 8);
        } while ((Compilation *)lVar31 != args);
      }
      ska::detailv3::
      sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
      ::~sherwood_v3_table(&local_a0);
      pcVar29 = extraout_RDX_05;
    }
    else {
      if (SVar2 != AnsiUdpPortList) {
        this_04 = (logic_error *)__cxa_allocate_exception(0x10);
        local_150[0].typeSyntax = (DataTypeSyntax *)local_140;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_150,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,"");
        plVar25 = (long *)std::__cxx11::string::append((char *)local_150);
        local_1b0._M_dataplus._M_p = (pointer)*plVar25;
        psVar27 = (size_type *)(plVar25 + 2);
        if ((size_type *)local_1b0._M_dataplus._M_p == psVar27) {
          local_1b0.field_2._M_allocated_capacity = *psVar27;
          local_1b0.field_2._8_8_ = plVar25[3];
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *psVar27;
        }
        local_1b0._M_string_length = plVar25[1];
        *plVar25 = (long)psVar27;
        plVar25[1] = 0;
        *(undefined1 *)(plVar25 + 2) = 0;
        std::__cxx11::to_string(&local_78,0x387);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1f8,&local_1b0,&local_78);
        plVar25 = (long *)std::__cxx11::string::append((char *)&local_1f8);
        local_218 = (undefined1  [8])*plVar25;
        plVar28 = plVar25 + 2;
        if (local_218 == (undefined1  [8])plVar28) {
          local_208 = *plVar28;
          lStack_200 = plVar25[3];
          local_218 = (undefined1  [8])&local_208;
        }
        else {
          local_208 = *plVar28;
        }
        uStack_210 = (Info *)plVar25[1];
        *plVar25 = (long)plVar28;
        plVar25[1] = 0;
        *(undefined1 *)(plVar25 + 2) = 0;
        plVar25 = (long *)std::__cxx11::string::append(local_218);
        local_128._0_8_ = *plVar25;
        pbVar30 = (bitmask<slang::ast::ASTFlags> *)(plVar25 + 2);
        if ((bitmask<slang::ast::ASTFlags> *)local_128._0_8_ == pbVar30) {
          local_118.m_bits = pbVar30->m_bits;
          pSStack_110 = (Symbol *)plVar25[3];
          local_128._0_8_ = &local_118;
        }
        else {
          local_118.m_bits = pbVar30->m_bits;
        }
        local_128._8_8_ = (Info *)plVar25[1];
        *plVar25 = (long)pbVar30;
        plVar25[1] = 0;
        *(undefined1 *)(plVar25 + 2) = 0;
        std::logic_error::logic_error(this_04,(string *)local_128);
        __cxa_throw(this_04,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_1c8 = slang::syntax::SyntaxNode::as<slang::syntax::AnsiUdpPortListSyntax>(pSVar34);
      local_1d0 = (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)
                  ((local_1c8->ports).elements.size_ + 1);
      pcVar29 = extraout_RDX_00;
      if ((SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)0x1 < local_1d0) {
        local_1c8 = (AnsiUdpPortListSyntax *)&local_1c8->ports;
        local_1d0 = (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)((ulong)local_1d0 >> 1)
        ;
        local_1c0 = (UdpPortDeclSyntax *)&this_01->super_Scope;
        index = (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)0x0;
        do {
          pUVar15 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::operator[]
                              ((SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)local_1c8,
                               (size_t)index);
          if ((pUVar15->super_SyntaxNode).kind == UdpOutputPortDecl) {
            pUVar16 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>
                                (&pUVar15->super_SyntaxNode);
            local_1b0._M_dataplus._M_p._4_4_ = (int)((ulong)local_1b0._M_dataplus._M_p >> 0x20);
            local_1b0._M_dataplus._M_p._0_4_ = 2 - (uint)((pUVar16->reg).info == (Info *)0x0);
            local_128 = (undefined1  [16])parsing::Token::valueText(&pUVar16->name);
            SVar17 = parsing::Token::location(&pUVar16->name);
            local_1f8._0_8_ = SVar17;
            pPVar18 = BumpAllocator::
                      emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection&>
                                (&local_1b8->super_BumpAllocator,local_1b8,
                                 (basic_string_view<char,_std::char_traits<char>_> *)local_128,
                                 (SourceLocation *)&local_1f8,(PrimitivePortDirection *)&local_1b0);
            local_218 = (undefined1  [8])pPVar18;
            (pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax = &pUVar15->super_SyntaxNode
            ;
            syntax_01.data_ =
                 (pUVar15->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
            syntax_01.size_ =
                 (pUVar15->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
            Symbol::setAttributes((Symbol *)pPVar18,scope,syntax_01);
            SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
            emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                      ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)local_190,
                       (PrimitivePortSymbol **)local_218);
            Scope::addMember((Scope *)local_1c0,(Symbol *)local_218);
            pcVar29 = extraout_RDX_01;
          }
          else {
            args = (Compilation *)
                   slang::syntax::SyntaxNode::as<slang::syntax::UdpInputPortDeclSyntax>
                             (&pUVar15->super_SyntaxNode);
            puVar32 = (undefined1 *)
                      ((long)&((args->symbolMapAllocator).super_BumpAllocator.head)->prev + 1);
            pcVar29 = extraout_RDX_02;
            if ((undefined1 *)0x1 < puVar32) {
              args = (Compilation *)
                     &(args->options).topModules.
                      super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      .hash_policy;
              index_01 = 0;
              do {
                pIVar19 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                          operator[]((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)
                                     args,index_01);
                local_128 = *(undefined1 (*) [16])&pIVar19->identifier;
                _local_218 = (Token)parsing::Token::valueText((Token *)local_128);
                local_1b0._M_dataplus._M_p = (pointer)parsing::Token::location((Token *)local_128);
                local_150[0].link = local_150[0].link & 0xffffffff00000000;
                pPVar18 = BumpAllocator::
                          emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                                    (&local_1b8->super_BumpAllocator,local_1b8,
                                     (basic_string_view<char,_std::char_traits<char>_> *)local_218,
                                     (SourceLocation *)&local_1b0,
                                     (PrimitivePortDirection *)local_150);
                local_1f8._0_8_ = pPVar18;
                (pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)pIVar19;
                syntax_02.data_ =
                     (pUVar15->attributes).
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     data_;
                syntax_02.size_ =
                     (pUVar15->attributes).
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     size_;
                Symbol::setAttributes((Symbol *)pPVar18,scope,syntax_02);
                SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
                emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                          ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)local_190,
                           (PrimitivePortSymbol **)&local_1f8);
                Scope::addMember((Scope *)local_1c0,(Symbol *)local_1f8._0_8_);
                index_01 = index_01 + 1;
                pcVar29 = extraout_RDX_03;
              } while ((ulong)puVar32 >> 1 != index_01);
            }
          }
          index = (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)
                  ((long)&(index->super_SyntaxListBase)._vptr_SyntaxListBase + 1);
        } while (index != local_1d0);
      }
      pUVar3 = (local_1d8->body).ptr;
      if (pUVar3 == (UdpBodySyntax *)0x0) {
        pcVar29 = 
        "T slang::not_null<slang::syntax::UdpBodySyntax *>::get() const [T = slang::syntax::UdpBodySyntax *]"
        ;
        goto LAB_001c6beb;
      }
      if ((pUVar3->portDecls).elements.size_ != 0) {
        pUVar15 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::operator[]
                            (&pUVar3->portDecls,0);
        SVar35 = slang::syntax::SyntaxNode::sourceRange(&pUVar15->super_SyntaxNode);
        Scope::addDiag(scope,(DiagCode)0x770006,SVar35);
        pcVar29 = extraout_RDX_04;
      }
    }
  }
  code.subsystem = Declarations;
  code.code = 0x83;
  pPVar23 = this_01;
  if (1 < local_190[0].len) {
    pPVar23 = (PrimitiveSymbol *)*local_190[0].data_;
    if (*(int *)&pPVar23->isSequential == 2) {
      this_01->isSequential = true;
      pSVar34 = (pPVar23->super_Symbol).originatingSyntax;
      if ((pSVar34 == (SyntaxNode *)0x0) || (pSVar34->kind != UdpOutputPortDecl)) {
LAB_001c671e:
        pSVar34 = (SyntaxNode *)0x0;
      }
      else {
        pUVar16 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>(pSVar34);
        pcVar29 = extraout_RDX_08;
        if (pUVar16->initializer == (EqualsValueClauseSyntax *)0x0) goto LAB_001c671e;
        pSVar34 = &((pUVar16->initializer->expr).ptr)->super_SyntaxNode;
        if (pSVar34 == (SyntaxNode *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                    );
        }
      }
      if (1 < local_190[0].len) {
        uVar26 = 1;
        do {
          if (*(int *)(*(long *)((long)local_190[0].data_ + uVar26 * 8) + 0x88) != 0) {
            Scope::addDiag(scope,(DiagCode)0x790006,
                           *(SourceLocation *)
                            (*(long *)((long)local_190[0].data_ + uVar26 * 8) + 0x18));
            pcVar29 = extraout_RDX_09;
            break;
          }
          uVar26 = uVar26 + 1;
          pcVar29 = (char *)local_190[0].data_;
        } while (local_190[0].len != uVar26);
      }
      sVar36._M_str = pcVar29;
      sVar36._M_len = (size_t)args;
      pUVar3 = (local_1d8->body).ptr;
      if (pUVar3 == (UdpBodySyntax *)0x0) {
        pcVar29 = 
        "T slang::not_null<slang::syntax::UdpBodySyntax *>::get() const [T = slang::syntax::UdpBodySyntax *]"
        ;
LAB_001c6bcc:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,pcVar29);
      }
      this = pUVar3->initialStmt;
      if (this != (UdpInitialStmtSyntax *)0x0) {
        if (this_01->isSequential == false) {
          SVar35 = slang::syntax::SyntaxNode::sourceRange(&this->super_SyntaxNode);
          Scope::addDiag(scope,(DiagCode)0x7b0006,SVar35);
          sVar36._M_str = extraout_RDX_11;
        }
        else if (pSVar34 == (SyntaxNode *)0x0) {
          pSVar34 = &((this->value).ptr)->super_SyntaxNode;
          if (pSVar34 == (SyntaxNode *)0x0) {
            pcVar29 = 
            "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
            ;
            goto LAB_001c6bcc;
          }
          arg = parsing::Token::valueText(&this->name);
          __n = arg._M_len;
          sVar36 = arg;
          if (__n != 0) {
            if (local_190[0].len == 0) {
              assert::assertFailed
                        ("index < len",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                         ,0x196,
                         "reference slang::SmallVectorBase<const slang::ast::PrimitivePortSymbol *>::operator[](size_type) [T = const slang::ast::PrimitivePortSymbol *]"
                        );
            }
            sVar5 = *(size_t *)((long)*local_190[0].data_ + 8);
            if (sVar5 != 0) {
              if (__n == sVar5) {
                iVar13 = bcmp(arg._M_str,*(void **)((long)*local_190[0].data_ + 0x10),__n);
                sVar36._M_str = extraout_RDX_20;
                sVar36._M_len = __n;
                if (iVar13 == 0) goto LAB_001c6807;
              }
              SVar35 = parsing::Token::range(&this->name);
              pDVar24 = Scope::addDiag(scope,(DiagCode)0x840006,SVar35);
              Diagnostic::operator<<(pDVar24,arg);
              if (local_190[0].len == 0) {
                assert::assertFailed
                          ("index < len",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                           ,0x196,
                           "reference slang::SmallVectorBase<const slang::ast::PrimitivePortSymbol *>::operator[](size_type) [T = const slang::ast::PrimitivePortSymbol *]"
                          );
              }
              Diagnostic::addNote(pDVar24,(DiagCode)0x40001,
                                  *(SourceLocation *)((long)*local_190[0].data_ + 0x18));
              sVar36._M_str = extraout_RDX_21;
              sVar36._M_len = __n;
            }
          }
        }
        else {
          SVar35 = slang::syntax::SyntaxNode::sourceRange(&this->super_SyntaxNode);
          pDVar24 = Scope::addDiag(scope,(DiagCode)0x780006,SVar35);
          local_128 = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(pSVar34);
          SVar17 = parsing::Token::location((Token *)local_128);
          Diagnostic::addNote(pDVar24,(DiagCode)0x80001,SVar17);
          sVar36._M_str = extraout_RDX_10;
        }
      }
LAB_001c6807:
      src = (EVP_PKEY_CTX *)sVar36._M_str;
      if (pSVar34 != (SyntaxNode *)0x0) {
        local_128._8_4_ = 0xffffffff;
        local_128._0_8_ = scope;
        local_118.m_bits = 0;
        pSStack_110 = (Symbol *)0x0;
        local_108 = (TempVarSymbol *)0x0;
        pRStack_100 = (RandomizeDetails *)0x0;
        local_f8 = (AssertionInstanceDetails *)0x0;
        iVar13 = Expression::bind((int)pSVar34,(sockaddr *)local_128,0);
        this_02 = (Expression *)CONCAT44(extraout_var_00,iVar13);
        bVar10 = Expression::bad(this_02);
        src = extraout_RDX_12;
        if (!bVar10) {
          if (this_02->kind == IntegerLiteral) {
            this_00 = (this_02->type).ptr;
            if (this_00 == (Type *)0x0) {
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x26,
                         "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                        );
            }
            bVar14 = Type::getBitWidth(this_00);
            if ((bVar14 == 1) ||
               (bVar10 = Expression::isUnsizedInteger(this_02), src = extraout_RDX_13, bVar10)) {
              ASTContext::eval((ConstantValue *)&local_58,(ASTContext *)local_128,this_02,
                               (bitmask<slang::ast::EvalFlags>)0x0);
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage(&local_58);
              src = extraout_RDX_14;
              if (&this_02->constant->value !=
                  (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   *)0x0) {
                this_03 = std::
                          get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                    (&this_02->constant->value);
                _local_218 = ZEXT814(0) << 0x30;
                TVar8 = _local_218;
                auVar6._8_4_ = 0;
                auVar6._0_8_ = uStack_210;
                _local_218 = auVar6 << 0x40;
                uStack_210._5_3_ = TVar8.info._5_3_;
                uStack_210._4_1_ = 1;
                _local_218 = ZEXT412(1) << 0x40;
                SVInt::clearUnusedBits((SVInt *)local_218);
                lVar11 = SVInt::operator==(this_03,(SVInt *)local_218);
                local_1f8.info._0_4_ = 2;
                local_1f8.kind = EndOfFile;
                local_1f8._2_1_ = 0;
                local_1f8.numFlags.raw = '\0';
                local_1f8.rawLen = 0;
                local_1f8.info._4_4_ = 0;
                SVInt::clearUnusedBits((SVInt *)&local_1f8);
                lVar12 = SVInt::operator==(this_03,(SVInt *)&local_1f8);
                bVar10 = false;
                cVar33 = -0x80;
                if (lVar12.value == '\0' && lVar11.value == '\0') {
                  cVar33 = '\0';
                }
                if (lVar12.value == '\x01') {
                  cVar33 = '\x01';
                }
                if (lVar11.value == '\x01') {
                  cVar33 = '\x01';
                }
                src = extraout_RDX_15;
                if ((this_03->super_SVIntStorage).bitWidth == 1) {
                  lVar11 = SVInt::operator[](this_03,0);
                  bVar10 = lVar11.value == 0x80;
                  src = extraout_RDX_16;
                }
                if (((0x40 < (uint)local_1f8.info) ||
                    (((undefined1  [16])local_1f8 & (undefined1  [16])0x10000000000) !=
                     (undefined1  [16])0x0)) && ((pointer)local_1f8._0_8_ != (pointer)0x0)) {
                  operator_delete__((void *)local_1f8._0_8_);
                  src = extraout_RDX_17;
                }
                if (((0x40 < (uint)uStack_210) ||
                    (((undefined1  [16])_local_218 & (undefined1  [16])0x10000000000) !=
                     (undefined1  [16])0x0)) && (local_218 != (undefined1  [8])0x0)) {
                  operator_delete__((void *)local_218);
                  src = extraout_RDX_18;
                }
                if (bVar10 || cVar33 != '\0' && (cVar33 != '@' && cVar33 != -0x80)) {
                  this_01->initVal = this_02->constant;
                }
              }
            }
          }
          if (this_01->initVal == (ConstantValue *)0x0) {
            Scope::addDiag(scope,(DiagCode)0x7a0006,this_02->sourceRange);
            src = extraout_RDX_19;
          }
        }
      }
      goto LAB_001c6677;
    }
    code.subsystem = Declarations;
    code.code = 0x7c;
    if (*(int *)&pPVar23->isSequential != 0) goto LAB_001c671e;
  }
  Scope::addDiag(scope,code,(pPVar23->super_Symbol).location);
  src = extraout_RDX_06;
LAB_001c6677:
  iVar13 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::copy
                     (local_190,(EVP_PKEY_CTX *)local_1b8,src);
  (this_01->ports).data_ = (pointer)CONCAT44(extraout_var,iVar13);
  (this_01->ports).size_ = extraout_RDX_07;
  if (local_190[0].data_ != (pointer)local_190[0].firstElement) {
    free(local_190[0].data_);
  }
  return this_01;
}

Assistant:

PrimitiveSymbol& PrimitiveSymbol::fromSyntax(const Scope& scope,
                                             const UdpDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto prim = comp.emplace<PrimitiveSymbol>(comp, syntax.name.valueText(), syntax.name.location(),
                                              PrimitiveSymbol::UserDefined);
    prim->setAttributes(scope, syntax.attributes);
    prim->setSyntax(syntax);

    SmallVector<const PrimitivePortSymbol*> ports;
    if (syntax.portList->kind == SyntaxKind::AnsiUdpPortList) {
        for (auto decl : syntax.portList->as<AnsiUdpPortListSyntax>().ports) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                PrimitivePortDirection dir = PrimitivePortDirection::Out;
                if (outputDecl.reg)
                    dir = PrimitivePortDirection::OutReg;

                auto port = comp.emplace<PrimitivePortSymbol>(comp, outputDecl.name.valueText(),
                                                              outputDecl.name.location(), dir);
                port->setSyntax(*decl);
                port->setAttributes(scope, decl->attributes);
                ports.push_back(port);
                prim->addMember(*port);
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(),
                                                                  name.location(),
                                                                  PrimitivePortDirection::In);

                    port->setSyntax(*nameSyntax);
                    port->setAttributes(scope, decl->attributes);
                    ports.push_back(port);
                    prim->addMember(*port);
                }
            }
        }

        if (!syntax.body->portDecls.empty())
            scope.addDiag(diag::PrimitiveAnsiMix, syntax.body->portDecls[0]->sourceRange());
    }
    else if (syntax.portList->kind == SyntaxKind::NonAnsiUdpPortList) {
        // In the non-ansi case the port list only gives the ordering, we need to
        // look through the body decls to get the rest of the port info.
        SmallMap<string_view, PrimitivePortSymbol*, 4> portMap;
        for (auto nameSyntax : syntax.portList->as<NonAnsiUdpPortListSyntax>().ports) {
            auto name = nameSyntax->identifier;
            auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(), name.location(),
                                                          PrimitivePortDirection::In);
            ports.push_back(port);
            prim->addMember(*port);
            if (!name.valueText().empty())
                portMap.emplace(name.valueText(), port);
        }

        auto checkDup = [&](auto port, auto nameToken) {
            // If this port already has a syntax node set it's a duplicate declaration.
            if (auto prevSyntax = port->getSyntax()) {
                auto& diag = scope.addDiag(diag::PrimitivePortDup, nameToken.range());
                diag << nameToken.valueText();
                diag.addNote(diag::NotePreviousDefinition, port->location);
            }
        };

        const UdpOutputPortDeclSyntax* regSpecifier = nullptr;
        for (auto decl : syntax.body->portDecls) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                if (auto it = portMap.find(outputDecl.name.valueText()); it != portMap.end()) {
                    // Standalone "reg" specifiers should be saved and processed at the
                    // end once we've handled all of the regular declarations.
                    if (outputDecl.reg && !outputDecl.keyword) {
                        if (regSpecifier) {
                            auto& diag = scope.addDiag(diag::PrimitiveRegDup,
                                                       outputDecl.reg.range());
                            diag.addNote(diag::NotePreviousDefinition,
                                         regSpecifier->reg.location());
                        }
                        regSpecifier = &outputDecl;
                        continue;
                    }

                    auto port = it->second;
                    checkDup(port, outputDecl.name);

                    port->direction = PrimitivePortDirection::Out;
                    if (outputDecl.reg)
                        port->direction = PrimitivePortDirection::OutReg;

                    port->location = outputDecl.name.location();
                    port->setSyntax(outputDecl);
                    port->setAttributes(scope, decl->attributes);
                }
                else {
                    auto& diag = scope.addDiag(diag::PrimitivePortUnknown, outputDecl.name.range());
                    diag << outputDecl.name.valueText();
                }
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    if (auto it = portMap.find(name.valueText()); it != portMap.end()) {
                        auto port = it->second;
                        checkDup(port, name);

                        // Direction is already set to In here, so just update
                        // our syntax, location, etc.
                        port->location = name.location();
                        port->setSyntax(*nameSyntax);
                        port->setAttributes(scope, decl->attributes);
                    }
                    else {
                        auto& diag = scope.addDiag(diag::PrimitivePortUnknown, name.range());
                        diag << name.valueText();
                    }
                }
            }
        }

        if (regSpecifier) {
            auto name = regSpecifier->name;
            auto it = portMap.find(name.valueText());
            ASSERT(it != portMap.end());

            auto port = it->second;
            if (port->getSyntax()) {
                if (port->direction == PrimitivePortDirection::OutReg) {
                    checkDup(port, name);
                }
                else if (port->direction == PrimitivePortDirection::In) {
                    auto& diag = scope.addDiag(diag::PrimitiveRegInput, name.range());
                    diag << port->name;
                }
                else {
                    port->direction = PrimitivePortDirection::OutReg;
                }
            }
        }

        for (auto port : ports) {
            if (!port->getSyntax()) {
                auto& diag = scope.addDiag(diag::PrimitivePortMissing, port->location);
                diag << port->name;
            }
        }
    }
    else if (syntax.portList->kind == SyntaxKind::WildcardUdpPortList) {
        // TODO:
    }
    else {
        ASSUME_UNREACHABLE;
    }

    if (ports.size() < 2)
        scope.addDiag(diag::PrimitiveTwoPorts, prim->location);
    else if (ports[0]->direction == PrimitivePortDirection::In)
        scope.addDiag(diag::PrimitiveOutputFirst, ports[0]->location);
    else {
        const ExpressionSyntax* initExpr = nullptr;
        if (ports[0]->direction == PrimitivePortDirection::OutReg) {
            prim->isSequential = true;

            // If the first port is an 'output reg' check if it specifies
            // the initial value inline.
            auto portSyntax = ports[0]->getSyntax();
            if (portSyntax && portSyntax->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outSyntax = portSyntax->as<UdpOutputPortDeclSyntax>();
                if (outSyntax.initializer)
                    initExpr = outSyntax.initializer->expr;
            }
        }

        // Make sure we have only one output port.
        for (size_t i = 1; i < ports.size(); i++) {
            if (ports[i]->direction != PrimitivePortDirection::In) {
                scope.addDiag(diag::PrimitiveDupOutput, ports[i]->location);
                break;
            }
        }

        // If we have an initial statement check it for correctness.
        if (auto initial = syntax.body->initialStmt) {
            if (!prim->isSequential)
                scope.addDiag(diag::PrimitiveInitialInComb, initial->sourceRange());
            else if (initExpr) {
                auto& diag = scope.addDiag(diag::PrimitiveDupInitial, initial->sourceRange());
                diag.addNote(diag::NotePreviousDefinition, initExpr->getFirstToken().location());
            }
            else {
                initExpr = initial->value;

                auto initialName = initial->name.valueText();
                if (!initialName.empty() && !ports[0]->name.empty() &&
                    initialName != ports[0]->name) {
                    auto& diag = scope.addDiag(diag::PrimitiveWrongInitial, initial->name.range());
                    diag << initialName;
                    diag.addNote(diag::NoteDeclarationHere, ports[0]->location);
                }
            }
        }

        if (initExpr) {
            ASTContext context(scope, LookupLocation::max);
            auto& expr = Expression::bind(*initExpr, context);
            if (!expr.bad()) {
                if (expr.kind == ExpressionKind::IntegerLiteral &&
                    (expr.type->getBitWidth() == 1 || expr.isUnsizedInteger())) {
                    context.eval(expr);
                    if (expr.constant) {
                        auto& val = expr.constant->integer();
                        if (val == 0 || val == 1 ||
                            (val.getBitWidth() == 1 && exactlyEqual(val[0], logic_t::x))) {
                            prim->initVal = expr.constant;
                        }
                    }
                }

                if (!prim->initVal)
                    scope.addDiag(diag::PrimitiveInitVal, expr.sourceRange);
            }
        }
    }

    // TODO: body

    prim->ports = ports.copy(comp);
    return *prim;
}